

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O3

void dxil_spv::build_exploded_composite_from_vector(Impl *impl,Instruction *value,uint active_lanes)

{
  uint uVar1;
  Id IVar2;
  Id type_id;
  int iVar3;
  iterator iVar4;
  Type *pTVar5;
  Operation *pOVar6;
  Instruction **ppIVar7;
  ulong uVar8;
  ulong uVar9;
  Instruction **__k;
  Id extracted [4];
  Instruction *local_58 [3];
  ulong local_40;
  Instruction *local_38;
  
  uVar9 = (ulong)active_lanes;
  __k = local_58;
  local_58[0] = value;
  iVar4 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_composite_meta)._M_h,(key_type *)__k);
  if ((iVar4.
       super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(char *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
                      ._M_cur + 0x19) == '\x01')) {
    pTVar5 = LLVMBC::Value::getType(&value->super_Value);
    uVar1 = LLVMBC::Type::getStructNumElements(pTVar5);
    IVar2 = Converter::Impl::get_id_for_value(impl,&value->super_Value,0);
    local_58[0] = (Instruction *)0x0;
    local_58[1] = (Instruction *)0x0;
    local_40 = uVar9;
    if (active_lanes != 0) {
      uVar8 = 0;
      do {
        pTVar5 = LLVMBC::Value::getType(&value->super_Value);
        pTVar5 = LLVMBC::Type::getStructElementType(pTVar5,(uint)uVar8);
        type_id = Converter::Impl::get_type_id(impl,pTVar5,0);
        pOVar6 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
        Operation::add_id(pOVar6,IVar2);
        Operation::add_literal(pOVar6,(uint)uVar8);
        Converter::Impl::add(impl,pOVar6,false);
        *(Id *)((long)local_58 + uVar8 * 4) = pOVar6->id;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    local_38 = value;
    pTVar5 = LLVMBC::Value::getType(&value->super_Value);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar5,0);
    pOVar6 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
    if (uVar1 != 0) {
      iVar3 = (int)local_40;
      uVar8 = 0;
      do {
        ppIVar7 = (Instruction **)((long)local_58 + (ulong)(iVar3 - 1) * 4);
        if (uVar8 < uVar9) {
          ppIVar7 = __k;
        }
        Operation::add_id(pOVar6,*(Id *)ppIVar7);
        uVar8 = uVar8 + 1;
        __k = (Instruction **)((long)__k + 4);
      } while (uVar1 != uVar8);
    }
    Converter::Impl::add(impl,pOVar6,false);
    Converter::Impl::rewrite_value(impl,&local_38->super_Value,pOVar6->id);
  }
  return;
}

Assistant:

void build_exploded_composite_from_vector(Converter::Impl &impl, const llvm::Instruction *value, unsigned active_lanes)
{
	auto itr = impl.llvm_composite_meta.find(value);
	if (itr == impl.llvm_composite_meta.end())
		return;

	auto &m = *itr;
	if (m.second.forced_struct)
	{
		// This value will be consumed by something other than plain OpCompositeExtract, force output struct type.
		unsigned elems = value->getType()->getStructNumElements();
		spv::Id id = impl.get_id_for_value(value);

		spv::Id extracted[4] = {};
		for (unsigned i = 0; i < active_lanes; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, impl.get_type_id(value->getType()->getStructElementType(i)));
			ext->add_id(id);
			ext->add_literal(i);
			impl.add(ext);
			extracted[i] = ext->id;
		}

		auto *struct_op = impl.allocate(spv::OpCompositeConstruct, impl.get_type_id(value->getType()));
		for (unsigned i = 0; i < elems; i++)
		{
			if (i < active_lanes)
				struct_op->add_id(extracted[i]);
			else
				struct_op->add_id(extracted[active_lanes - 1]);
		}

		impl.add(struct_op);
		impl.rewrite_value(value, struct_op->id);
	}
}